

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printTotalsDivider(ConsoleReporter *this,Totals *totals)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  IColourImpl *pIVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  Colour local_51;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  sVar1 = (totals->testCases).passed;
  uVar11 = (totals->testCases).failed + sVar1 + (totals->testCases).failedButOk;
  if (uVar11 == 0) {
    poVar4 = (this->super_StreamingReporterBase).stream;
    local_51.m_moved = false;
    pIVar7 = Colour::impl();
    (**(code **)(*(long *)pIVar7 + 0x10))(pIVar7,6);
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,'O');
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_50,local_48);
    if (local_50 == local_40) goto LAB_00148b48;
  }
  else {
    sVar2 = (totals->testCases).failed;
    sVar3 = (totals->testCases).failedButOk;
    uVar8 = sVar2 * 0x50;
    uVar5 = uVar8 / uVar11;
    uVar9 = uVar5;
    if (uVar8 < uVar11) {
      uVar9 = 1;
    }
    if (sVar2 == 0) {
      uVar9 = uVar5;
    }
    uVar8 = sVar3 * 0x50;
    uVar6 = uVar8 / uVar11;
    uVar5 = uVar6;
    if (uVar8 < uVar11) {
      uVar5 = 1;
    }
    if (sVar3 == 0) {
      uVar5 = uVar6;
    }
    uVar6 = (sVar1 * 0x50) / uVar11;
    uVar8 = 1;
    if (uVar11 <= sVar1 * 0x50) {
      uVar8 = uVar6;
    }
    if (sVar1 == 0) {
      uVar8 = uVar6;
    }
    uVar11 = uVar5 + uVar9 + uVar8;
    while (uVar11 < 0x4f) {
      uVar6 = uVar8;
      if (uVar8 < uVar5) {
        uVar6 = uVar5;
      }
      if (uVar5 < uVar9 && uVar8 < uVar9) {
        uVar6 = uVar9;
      }
      uVar6 = uVar6 + 1;
      uVar10 = uVar6;
      uVar11 = uVar5;
      if (uVar8 < uVar5) {
        uVar10 = uVar8;
        uVar11 = uVar6;
      }
      if (uVar5 >= uVar9 || uVar8 >= uVar9) {
        uVar6 = uVar9;
        uVar5 = uVar11;
        uVar8 = uVar10;
      }
      uVar9 = uVar6;
      uVar11 = uVar5 + uVar6 + uVar8;
    }
    uVar11 = uVar5 + uVar9 + uVar8;
    while (0x4f < uVar11) {
      uVar11 = uVar8;
      if (uVar8 < uVar5) {
        uVar11 = uVar5;
      }
      if (uVar5 < uVar9 && uVar8 < uVar9) {
        uVar11 = uVar9;
      }
      uVar11 = uVar11 - 1;
      uVar10 = uVar11;
      uVar6 = uVar5;
      if (uVar8 < uVar5) {
        uVar10 = uVar8;
        uVar6 = uVar11;
      }
      if (uVar5 < uVar9 && uVar8 < uVar9) {
        uVar9 = uVar11;
        uVar6 = uVar5;
        uVar10 = uVar8;
      }
      uVar5 = uVar6;
      uVar8 = uVar10;
      uVar11 = uVar6 + uVar9 + uVar10;
    }
    poVar4 = (this->super_StreamingReporterBase).stream;
    local_51.m_moved = false;
    pIVar7 = Colour::impl();
    (**(code **)(*(long *)pIVar7 + 0x10))(pIVar7,0x12);
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    Colour::~Colour(&local_51);
    poVar4 = (this->super_StreamingReporterBase).stream;
    local_51.m_moved = false;
    pIVar7 = Colour::impl();
    (**(code **)(*(long *)pIVar7 + 0x10))(pIVar7,6);
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    Colour::~Colour(&local_51);
    poVar4 = (this->super_StreamingReporterBase).stream;
    if ((totals->testCases).failedButOk == 0 && (totals->testCases).failed == 0) {
      local_51.m_moved = false;
      pIVar7 = Colour::impl();
      (**(code **)(*(long *)pIVar7 + 0x10))(pIVar7,0x13);
      local_50 = local_40;
      std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_50,local_48);
    }
    else {
      local_51.m_moved = false;
      pIVar7 = Colour::impl();
      (**(code **)(*(long *)pIVar7 + 0x10))(pIVar7,3);
      local_50 = local_40;
      std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_50,local_48);
    }
    if (local_50 == local_40) goto LAB_00148b48;
  }
  operator_delete(local_50);
LAB_00148b48:
  Colour::~Colour(&local_51);
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase).stream,"\n",1);
  return;
}

Assistant:

void printTotalsDivider( Totals const& totals ) {
            if( totals.testCases.total() > 0 ) {
                std::size_t failedRatio = makeRatio( totals.testCases.failed, totals.testCases.total() );
                std::size_t failedButOkRatio = makeRatio( totals.testCases.failedButOk, totals.testCases.total() );
                std::size_t passedRatio = makeRatio( totals.testCases.passed, totals.testCases.total() );
                while( failedRatio + failedButOkRatio + passedRatio < CATCH_CONFIG_CONSOLE_WIDTH-1 )
                    findMax( failedRatio, failedButOkRatio, passedRatio )++;
                while( failedRatio + failedButOkRatio + passedRatio > CATCH_CONFIG_CONSOLE_WIDTH-1 )
                    findMax( failedRatio, failedButOkRatio, passedRatio )--;

                stream << Colour( Colour::Error ) << std::string( failedRatio, '=' );
                stream << Colour( Colour::ResultExpectedFailure ) << std::string( failedButOkRatio, '=' );
                if( totals.testCases.allPassed() )
                    stream << Colour( Colour::ResultSuccess ) << std::string( passedRatio, '=' );
                else
                    stream << Colour( Colour::Success ) << std::string( passedRatio, '=' );
            }
            else {
                stream << Colour( Colour::Warning ) << std::string( CATCH_CONFIG_CONSOLE_WIDTH-1, '=' );
            }
            stream << "\n";
        }